

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O2

int ffcphd(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  FITSfile *pFVar4;
  size_t __n;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  int nkeys;
  long naxis;
  char *local_98;
  long naxes [1];
  char comm [73];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    if (infptr == outfptr) {
      *status = 0x65;
      iVar2 = 0x65;
    }
    else {
      if (infptr->HDUposition != infptr->Fptr->curhdu) {
        ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
      }
      iVar2 = ffghsp(infptr,&nkeys,(int *)0x0,status);
      if (iVar2 < 1) {
        uVar8 = (ulong)nkeys;
        pcVar3 = (char *)malloc(uVar8 * 0x51);
        if (pcVar3 == (char *)0x0) {
          *status = 0x71;
          return 0x71;
        }
        lVar7 = 0;
        local_98 = pcVar3;
        while (lVar7 < (int)uVar8) {
          lVar7 = lVar7 + 1;
          ffgrec(infptr,(int)lVar7,pcVar3,status);
          pcVar3 = pcVar3 + 0x51;
          uVar8 = (ulong)(uint)nkeys;
        }
        iVar2 = infptr->HDUposition;
        naxis = -1;
        if (infptr->Fptr->hdutype == 0) {
          ffgkyj(infptr,"NAXIS",&naxis,(char *)0x0,status);
        }
        iVar5 = outfptr->HDUposition;
        pFVar4 = outfptr->Fptr;
        if (iVar5 != pFVar4->curhdu) {
          ffmahd(outfptr,iVar5 + 1,(int *)0x0,status);
          pFVar4 = outfptr->Fptr;
          iVar5 = pFVar4->curhdu;
        }
        if (pFVar4->headend != pFVar4->headstart[iVar5]) {
          ffcrhd(outfptr,status);
        }
        bVar1 = 1;
        if (outfptr->HDUposition == 0) {
          if (naxis < 0) {
            ffcrim(outfptr,8,0,naxes,status);
            ffcrhd(outfptr,status);
          }
          else {
            bVar1 = 0;
          }
        }
        pcVar3 = local_98;
        iVar5 = *status;
        if (0 < iVar5) {
          free(local_98);
          return iVar5;
        }
        if ((bool)(iVar2 != 0 | bVar1 ^ 1)) {
          if ((bool)(iVar2 != 0 & (bVar1 ^ 1))) {
            builtin_strncpy(comm,"file does conform to FITS standard",0x23);
            ffpkyl(outfptr,"SIMPLE",1,comm,status);
            pcVar6 = pcVar3;
            for (lVar7 = 1; pcVar6 = pcVar6 + 0x51, lVar7 < naxis + 3; lVar7 = lVar7 + 1) {
              ffprec(outfptr,pcVar6,status);
            }
            builtin_strncpy(comm,"FITS dataset may contain extensions",0x24);
            ffpkyl(outfptr,"EXTEND",1,comm,status);
            ffprec(outfptr,
                   "COMMENT   FITS (Flexible Image Transport System) format is defined in \'Astronomy"
                   ,status);
            ffprec(outfptr,
                   "COMMENT   and Astrophysics\', volume 376, page 359; bibcode: 2001A&A...376..359H"
                   ,status);
            lVar7 = (long)((int)naxis + 3);
            pcVar3 = pcVar3 + lVar7 * 0x51;
            for (; lVar7 < nkeys; lVar7 = lVar7 + 1) {
              if (*pcVar3 == 'G') {
                pcVar6 = "GCOUNT  ";
LAB_0012b2ed:
                iVar2 = strncmp(pcVar3,pcVar6,8);
                if (iVar2 != 0) goto LAB_0012b2f9;
              }
              else {
                if (*pcVar3 == 'P') {
                  pcVar6 = "PCOUNT  ";
                  goto LAB_0012b2ed;
                }
LAB_0012b2f9:
                ffprec(outfptr,pcVar3,status);
              }
              pcVar3 = pcVar3 + 0x51;
            }
          }
          else {
            for (lVar7 = 0; lVar7 < nkeys; lVar7 = lVar7 + 1) {
              ffprec(outfptr,pcVar3,status);
              pcVar3 = pcVar3 + 0x51;
            }
          }
        }
        else {
          builtin_strncpy(comm,"IMAGE extension",0x10);
          ffpkys(outfptr,"XTENSION","IMAGE",comm,status);
          pcVar6 = local_98;
          pcVar3 = local_98;
          for (lVar7 = 1; pcVar3 = pcVar3 + 0x51, lVar7 < naxis + 3; lVar7 = lVar7 + 1) {
            ffprec(outfptr,pcVar3,status);
          }
          builtin_strncpy(comm,"number of random group parameters",0x22);
          ffpkyj(outfptr,"PCOUNT",0,comm,status);
          builtin_strncpy(comm,"number of random groups",0x18);
          ffpkyj(outfptr,"GCOUNT",1,comm,status);
          lVar7 = (long)((int)naxis + 3);
          pcVar6 = pcVar6 + lVar7 * 0x51;
          for (; lVar7 < nkeys; lVar7 = lVar7 + 1) {
            if (*pcVar6 == 'C') {
              iVar2 = strncmp(pcVar6,"COMMENT   FITS (Flexible Image Transport System) format is",
                              0x3a);
              if (iVar2 != 0) {
                pcVar3 = "COMMENT   and Astrophysics\', volume 376, page 3";
                __n = 0x2f;
                goto LAB_0012b1c7;
              }
            }
            else {
              if (*pcVar6 == 'E') {
                pcVar3 = "EXTEND  ";
                __n = 8;
LAB_0012b1c7:
                iVar2 = strncmp(pcVar6,pcVar3,__n);
                if (iVar2 == 0) goto LAB_0012b1de;
              }
              ffprec(outfptr,pcVar6,status);
            }
LAB_0012b1de:
            pcVar6 = pcVar6 + 0x51;
          }
        }
        free(local_98);
      }
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffcphd(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
/*
  copy the header keywords from infptr to outfptr.
*/
{
    int nkeys, ii, inPrim = 0, outPrim = 0;
    long naxis, naxes[1];
    char *card, comm[FLEN_COMMENT];
    char *tmpbuff;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    /* set the input pointer to the correct HDU */
    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);

    if (ffghsp(infptr, &nkeys, NULL, status) > 0) /* get no. of keywords */
        return(*status);

    /* create a memory buffer to hold the header records */
    tmpbuff = (char*) malloc(nkeys*FLEN_CARD*sizeof(char));
    if (!tmpbuff)
        return(*status = MEMORY_ALLOCATION);

    /* read all of the header records in the input HDU */
    for (ii = 0; ii < nkeys; ii++)
      ffgrec(infptr, ii+1, tmpbuff + (ii * FLEN_CARD), status);

    if (infptr->HDUposition == 0)  /* set flag if this is the Primary HDU */
       inPrim = 1;

    /* if input is an image hdu, get the number of axes */
    naxis = -1;   /* negative if HDU is a table */
    if ((infptr->Fptr)->hdutype == IMAGE_HDU)
        ffgkyj(infptr, "NAXIS", &naxis, NULL, status);

    /* set the output pointer to the correct HDU */
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);

    /* check if output header is empty; if not create new empty HDU */
    if ((outfptr->Fptr)->headend !=
        (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu] )
           ffcrhd(outfptr, status);   

    if (outfptr->HDUposition == 0)
    {
        if (naxis < 0)
        {
            /* the input HDU is a table, so we have to create */
            /* a dummy Primary array before copying it to the output */
            ffcrim(outfptr, 8, 0, naxes, status);
            ffcrhd(outfptr, status); /* create new empty HDU */
        }
        else
        {
            /* set flag that this is the Primary HDU */
            outPrim = 1;
        }
    }

    if (*status > 0)  /* check for errors before proceeding */
    {
        free(tmpbuff);
        return(*status);
    }
    if ( inPrim == 1 && outPrim == 0 )
    {
        /* copying from primary array to image extension */
        strcpy(comm, "IMAGE extension");
        ffpkys(outfptr, "XTENSION", "IMAGE", comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        strcpy(comm, "number of random group parameters");
        ffpkyj(outfptr, "PCOUNT", 0, comm, status);
  
        strcpy(comm, "number of random groups");
        ffpkyj(outfptr, "GCOUNT", 1, comm, status);


        /* copy remaining keywords, excluding EXTEND, and reference COMMENT keywords */
        for (ii = 3 + naxis ; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "EXTEND  ", 8) &&
                FSTRNCMP(card, "COMMENT   FITS (Flexible Image Transport System) format is", 58) && 
                FSTRNCMP(card, "COMMENT   and Astrophysics', volume 376, page 3", 47) )
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else if ( inPrim == 0 && outPrim == 1 )
    {
        /* copying between image extension and primary array */
        strcpy(comm, "file does conform to FITS standard");
        ffpkyl(outfptr, "SIMPLE", TRUE, comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        /* add the EXTEND keyword */
        strcpy(comm, "FITS dataset may contain extensions");
        ffpkyl(outfptr, "EXTEND", TRUE, comm, status);

      /* write standard block of self-documentating comments */
      ffprec(outfptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(outfptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status);

        /* copy remaining keywords, excluding pcount, gcount */
        for (ii = 3 + naxis; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "PCOUNT  ", 8) && FSTRNCMP(card, "GCOUNT  ", 8))
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else
    {
        /* input and output HDUs are same type; simply copy all keywords */
        for (ii = 0; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }
    }

    free(tmpbuff);
    return(*status);
}